

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O1

void __thiscall
cfd::core::ConfidentialTxInReference::ConfidentialTxInReference(ConfidentialTxInReference *this)

{
  Txid local_190;
  ConfidentialTxIn local_170;
  
  Txid::Txid(&local_190);
  ConfidentialTxIn::ConfidentialTxIn(&local_170,&local_190,0,0);
  ConfidentialTxInReference(this,&local_170);
  ConfidentialTxIn::~ConfidentialTxIn(&local_170);
  local_190._vptr_Txid = (_func_int **)&PTR__Txid_00735400;
  if (local_190.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_190.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

ConfidentialTxInReference::ConfidentialTxInReference()
    : ConfidentialTxInReference(ConfidentialTxIn(Txid(), 0, 0)) {
  // do nothing
}